

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

json_token * __thiscall
mjs::anon_unknown_46::json_lexer::next_token(json_token *__return_storage_ptr__,json_lexer *this)

{
  uint uVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  undefined4 *puVar5;
  int *piVar6;
  wostream *pwVar7;
  native_error_exception *pnVar8;
  global_object *pgVar9;
  uint *puVar10;
  wchar_t *s_00;
  bool local_1109;
  wstring local_10e8 [32];
  wstring_view local_10c8;
  wstring local_10b8;
  wstring_view local_1098;
  wstring local_1088 [32];
  mjs local_1068 [16];
  wstring local_1058;
  wostringstream local_1038 [8];
  wostringstream woss_6;
  json_token local_ec0;
  undefined1 local_e89;
  wstring local_e88 [32];
  wstring_view local_e68;
  wstring local_e58;
  wstring_view local_e38;
  wstring local_e28 [32];
  mjs local_e08 [16];
  wstring local_df8;
  wostringstream local_dd8 [8];
  wostringstream woss_5;
  wstring local_c58 [32];
  wstring_view local_c38;
  wstring local_c28;
  wstring_view local_c08;
  wostringstream local_bf8 [8];
  wostringstream woss_4;
  wostringstream woss_3;
  runtime_error *anon_var_0;
  wstring local_890 [32];
  wstring_view local_870;
  wstring local_860;
  wstring_view local_840;
  wostringstream local_830 [8];
  wostringstream woss_2;
  wstring local_6b0 [32];
  wstring_view local_690;
  wstring local_680;
  wstring_view local_660;
  wostringstream local_650 [8];
  wostringstream woss_1;
  wstring local_4d0 [4];
  char16_t sch;
  wstring_view local_4b0;
  wstring local_4a0;
  wstring_view local_480;
  wostringstream local_470 [8];
  wostringstream woss;
  undefined1 local_2f0 [7];
  bool escape;
  wstring s;
  wstring local_2c0;
  json_token local_2a0;
  undefined1 local_270 [8];
  anon_class_24_3_fd8a6a9b decimal_digits;
  anon_class_16_2_032a7d33 invalid;
  json_token local_218;
  json_token local_1e8;
  json_token local_1b8;
  json_token local_188;
  json_token local_158;
  json_token local_128;
  json_token local_f8;
  json_token local_c8;
  json_token local_98;
  ulong local_68;
  size_t end;
  undefined1 auStack_58 [6];
  char16_t ch;
  size_t start;
  ulong local_20;
  size_type len;
  json_lexer *this_local;
  
  len = (size_type)this;
  this_local = (json_lexer *)__return_storage_ptr__;
  local_20 = std::__cxx11::wstring::length();
  if (this->pos_ < local_20) {
    _auStack_58 = (gc_heap *)this->pos_;
    puVar5 = (undefined4 *)std::__cxx11::wstring::operator[]((ulong)&this->text_);
    end._6_2_ = (char16_t)*puVar5;
    local_68 = this->pos_ + 1;
    this->pos_ = local_68;
    bVar2 = json_is_whitespace(end._6_2_);
    if (bVar2) {
      while( true ) {
        local_1109 = false;
        if (local_68 < local_20) {
          puVar5 = (undefined4 *)std::__cxx11::wstring::operator[]((ulong)&this->text_);
          local_1109 = json_is_whitespace((char16_t)*puVar5);
        }
        if (local_1109 == false) break;
        local_68 = local_68 + 1;
      }
      json_token::json_token(&local_98,whitespace,(size_t)_auStack_58);
      json_token::operator=(&this->tok_,&local_98);
      json_token::~json_token(&local_98);
    }
    else if (end._6_2_ == L'[') {
      json_token::json_token(&local_c8,lbracket,(size_t)_auStack_58);
      json_token::operator=(&this->tok_,&local_c8);
      json_token::~json_token(&local_c8);
    }
    else if (end._6_2_ == L']') {
      json_token::json_token(&local_f8,rbracket,(size_t)_auStack_58);
      json_token::operator=(&this->tok_,&local_f8);
      json_token::~json_token(&local_f8);
    }
    else if (end._6_2_ == L'{') {
      json_token::json_token(&local_128,lbrace,(size_t)_auStack_58);
      json_token::operator=(&this->tok_,&local_128);
      json_token::~json_token(&local_128);
    }
    else if (end._6_2_ == L'}') {
      json_token::json_token(&local_158,rbrace,(size_t)_auStack_58);
      json_token::operator=(&this->tok_,&local_158);
      json_token::~json_token(&local_158);
    }
    else if (end._6_2_ == L',') {
      json_token::json_token(&local_188,comma,(size_t)_auStack_58);
      json_token::operator=(&this->tok_,&local_188);
      json_token::~json_token(&local_188);
    }
    else if (end._6_2_ == L':') {
      json_token::json_token(&local_1b8,colon,(size_t)_auStack_58);
      json_token::operator=(&this->tok_,&local_1b8);
      json_token::~json_token(&local_1b8);
    }
    else if ((end._6_2_ == L'n') &&
            (iVar4 = std::__cxx11::wstring::compare((ulong)&this->text_,local_68,(wchar_t *)0x3),
            iVar4 == 0)) {
      local_68 = local_68 + 3;
      json_token::json_token(&local_1e8,null,(size_t)_auStack_58);
      json_token::operator=(&this->tok_,&local_1e8);
      json_token::~json_token(&local_1e8);
    }
    else if ((end._6_2_ == L'f') &&
            (iVar4 = std::__cxx11::wstring::compare((ulong)&this->text_,local_68,(wchar_t *)0x4),
            iVar4 == 0)) {
      local_68 = local_68 + 4;
      json_token::json_token(&local_218,false_,(size_t)_auStack_58);
      json_token::operator=(&this->tok_,&local_218);
      json_token::~json_token(&local_218);
    }
    else if ((end._6_2_ == L't') &&
            (iVar4 = std::__cxx11::wstring::compare((ulong)&this->text_,local_68,(wchar_t *)0x3),
            iVar4 == 0)) {
      local_68 = local_68 + 3;
      json_token::json_token((json_token *)&invalid.this,true_,(size_t)_auStack_58);
      json_token::operator=(&this->tok_,(json_token *)&invalid.this);
      json_token::~json_token((json_token *)&invalid.this);
    }
    else {
      if ((end._6_2_ != L'-') && (bVar2 = json_is_digit(end._6_2_), !bVar2)) {
        if (end._6_2_ != L'\"') {
          std::__cxx11::wostringstream::wostringstream(local_1038);
          pwVar7 = std::operator<<((wostream *)local_1038,"Unexpected token \"");
          std::__cxx11::wstring::substr((ulong)local_1088,(ulong)&this->text_);
          local_1068 = (mjs  [16])
                       std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1088);
          cpp_quote_abi_cxx11_(&local_1058,local_1068,local_1068._8_8_);
          pwVar7 = std::operator<<(pwVar7,(wstring *)&local_1058);
          pwVar7 = std::operator<<(pwVar7,"\" in JSON at position ");
          std::wostream::operator<<(pwVar7,(ulong)_auStack_58);
          std::__cxx11::wstring::~wstring((wstring *)&local_1058);
          std::__cxx11::wstring::~wstring(local_1088);
          pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
          pgVar9 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
          global_object::stack_trace_abi_cxx11_(&local_10b8,pgVar9);
          local_1098 = (wstring_view)
                       std::__cxx11::wstring::operator_cast_to_basic_string_view
                                 ((wstring *)&local_10b8);
          std::__cxx11::wostringstream::str();
          local_10c8 = (wstring_view)
                       std::__cxx11::wstring::operator_cast_to_basic_string_view(local_10e8);
          native_error_exception::native_error_exception(pnVar8,syntax,&local_1098,&local_10c8);
          __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                      native_error_exception::~native_error_exception);
        }
        std::__cxx11::wstring::wstring((wstring *)local_2f0);
        bVar2 = false;
        do {
          while( true ) {
            if (local_68 == local_20) {
              std::__cxx11::wostringstream::wostringstream(local_470);
              pwVar7 = std::operator<<((wostream *)local_470,
                                       "Unterminated string in JSON at position ");
              std::wostream::operator<<(pwVar7,(ulong)_auStack_58);
              pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
              pgVar9 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
              global_object::stack_trace_abi_cxx11_(&local_4a0,pgVar9);
              local_480 = (wstring_view)
                          std::__cxx11::wstring::operator_cast_to_basic_string_view
                                    ((wstring *)&local_4a0);
              std::__cxx11::wostringstream::str();
              local_4b0 = (wstring_view)
                          std::__cxx11::wstring::operator_cast_to_basic_string_view(local_4d0);
              native_error_exception::native_error_exception(pnVar8,syntax,&local_480,&local_4b0);
              __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                          native_error_exception::~native_error_exception);
            }
            local_68 = local_68 + 1;
            puVar10 = (uint *)std::__cxx11::wstring::operator[]((ulong)&this->text_);
            uVar1 = *puVar10;
            uVar3 = (ushort)uVar1;
            if (!bVar2) break;
            if (local_68 == local_20) {
              std::__cxx11::wostringstream::wostringstream(local_650);
              pwVar7 = std::operator<<((wostream *)local_650,
                                       "Unterminated escape sequence in JSON at position ");
              std::wostream::operator<<(pwVar7,local_68 - 1);
              pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
              pgVar9 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
              global_object::stack_trace_abi_cxx11_(&local_680,pgVar9);
              local_660 = (wstring_view)
                          std::__cxx11::wstring::operator_cast_to_basic_string_view
                                    ((wstring *)&local_680);
              std::__cxx11::wostringstream::str();
              local_690 = (wstring_view)
                          std::__cxx11::wstring::operator_cast_to_basic_string_view(local_6b0);
              native_error_exception::native_error_exception(pnVar8,syntax,&local_660,&local_690);
              __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                          native_error_exception::~native_error_exception);
            }
            switch(uVar1 & 0xffff) {
            case 0x22:
            case 0x2f:
            case 0x5c:
              std::__cxx11::wstring::push_back((wchar_t)local_2f0);
              break;
            default:
              std::__cxx11::wostringstream::wostringstream(local_bf8);
              pwVar7 = std::operator<<((wostream *)local_bf8,"Invalid escape sequence \"\\");
              pwVar7 = std::operator<<(pwVar7,uVar1 & 0xffff);
              pwVar7 = std::operator<<(pwVar7,"\" in JSON at position ");
              std::wostream::operator<<(pwVar7,local_68 - 1);
              pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
              pgVar9 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
              global_object::stack_trace_abi_cxx11_(&local_c28,pgVar9);
              local_c08 = (wstring_view)
                          std::__cxx11::wstring::operator_cast_to_basic_string_view
                                    ((wstring *)&local_c28);
              std::__cxx11::wostringstream::str();
              local_c38 = (wstring_view)
                          std::__cxx11::wstring::operator_cast_to_basic_string_view(local_c58);
              native_error_exception::native_error_exception(pnVar8,syntax,&local_c08,&local_c38);
              __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                          native_error_exception::~native_error_exception);
            case 0x62:
              std::__cxx11::wstring::push_back((wchar_t)local_2f0);
              break;
            case 0x66:
              std::__cxx11::wstring::push_back((wchar_t)local_2f0);
              break;
            case 0x6e:
              std::__cxx11::wstring::push_back((wchar_t)local_2f0);
              break;
            case 0x72:
              std::__cxx11::wstring::push_back((wchar_t)local_2f0);
              break;
            case 0x74:
              std::__cxx11::wstring::push_back((wchar_t)local_2f0);
              break;
            case 0x75:
              if (local_20 < local_68 + 5) {
                std::__cxx11::wostringstream::wostringstream(local_830);
                pwVar7 = std::operator<<((wostream *)local_830,
                                         "Unterminated escape sequence in JSON at position ");
                std::wostream::operator<<(pwVar7,local_68 - 1);
                pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
                pgVar9 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
                global_object::stack_trace_abi_cxx11_(&local_860,pgVar9);
                local_840 = (wstring_view)
                            std::__cxx11::wstring::operator_cast_to_basic_string_view
                                      ((wstring *)&local_860);
                std::__cxx11::wostringstream::str();
                local_870 = (wstring_view)
                            std::__cxx11::wstring::operator_cast_to_basic_string_view(local_890);
                native_error_exception::native_error_exception(pnVar8,syntax,&local_840,&local_870);
                __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                            native_error_exception::~native_error_exception);
              }
              s_00 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)&this->text_);
              get_hex_value4(s_00);
              std::__cxx11::wstring::push_back((wchar_t)local_2f0);
              local_68 = local_68 + 4;
            }
            bVar2 = false;
          }
          if (uVar3 == 0x22) {
            json_token::json_token(&local_ec0,string,(wstring *)local_2f0,(size_t)_auStack_58);
            json_token::operator=(&this->tok_,&local_ec0);
            json_token::~json_token(&local_ec0);
            std::__cxx11::wstring::~wstring((wstring *)local_2f0);
            goto LAB_0018131d;
          }
          if (uVar3 == 0x5c) {
            bVar2 = true;
          }
          else {
            if (uVar3 < 0x20) {
              std::__cxx11::wostringstream::wostringstream(local_dd8);
              pwVar7 = std::operator<<((wostream *)local_dd8,"Invalid character \"");
              std::__cxx11::wstring::substr((ulong)local_e28,(ulong)&this->text_);
              local_e08 = (mjs  [16])
                          std::__cxx11::wstring::operator_cast_to_basic_string_view(local_e28);
              cpp_quote_abi_cxx11_(&local_df8,local_e08,local_e08._8_8_);
              pwVar7 = std::operator<<(pwVar7,(wstring *)&local_df8);
              pwVar7 = std::operator<<(pwVar7,"\" in JSON at position ");
              std::wostream::operator<<(pwVar7,local_68 - 1);
              std::__cxx11::wstring::~wstring((wstring *)&local_df8);
              std::__cxx11::wstring::~wstring(local_e28);
              local_e89 = 1;
              pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
              pgVar9 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
              global_object::stack_trace_abi_cxx11_(&local_e58,pgVar9);
              local_e38 = (wstring_view)
                          std::__cxx11::wstring::operator_cast_to_basic_string_view
                                    ((wstring *)&local_e58);
              std::__cxx11::wostringstream::str();
              local_e68 = (wstring_view)
                          std::__cxx11::wstring::operator_cast_to_basic_string_view(local_e88);
              native_error_exception::native_error_exception(pnVar8,syntax,&local_e38,&local_e68);
              local_e89 = 0;
              __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                          native_error_exception::~native_error_exception);
            }
            std::__cxx11::wstring::push_back((wchar_t)local_2f0);
          }
        } while( true );
      }
      decimal_digits.this = (json_lexer *)auStack_58;
      local_270 = (undefined1  [8])&local_68;
      decimal_digits.end = &local_20;
      decimal_digits.len = (size_type *)this;
      invalid.start = (size_t *)this;
      bVar2 = next_token::anon_class_24_3_fd8a6a9b::operator()
                        ((anon_class_24_3_fd8a6a9b *)local_270);
      if ((!bVar2) && (end._6_2_ == L'-')) {
        next_token::anon_class_16_2_032a7d33::operator()
                  ((anon_class_16_2_032a7d33 *)&decimal_digits.this);
      }
      if ((local_68 < local_20) &&
         (piVar6 = (int *)std::__cxx11::wstring::operator[]((ulong)&this->text_), *piVar6 == 0x2e))
      {
        local_68 = local_68 + 1;
        bVar2 = next_token::anon_class_24_3_fd8a6a9b::operator()
                          ((anon_class_24_3_fd8a6a9b *)local_270);
        if (!bVar2) {
          next_token::anon_class_16_2_032a7d33::operator()
                    ((anon_class_16_2_032a7d33 *)&decimal_digits.this);
        }
      }
      if ((local_68 < local_20) &&
         ((piVar6 = (int *)std::__cxx11::wstring::operator[]((ulong)&this->text_), *piVar6 == 0x65
          || (piVar6 = (int *)std::__cxx11::wstring::operator[]((ulong)&this->text_),
             *piVar6 == 0x45)))) {
        local_68 = local_68 + 1;
        if (local_68 == local_20) {
          next_token::anon_class_16_2_032a7d33::operator()
                    ((anon_class_16_2_032a7d33 *)&decimal_digits.this);
        }
        piVar6 = (int *)std::__cxx11::wstring::operator[]((ulong)&this->text_);
        if ((*piVar6 == 0x2d) ||
           (piVar6 = (int *)std::__cxx11::wstring::operator[]((ulong)&this->text_), *piVar6 == 0x2b)
           ) {
          local_68 = local_68 + 1;
        }
        bVar2 = next_token::anon_class_24_3_fd8a6a9b::operator()
                          ((anon_class_24_3_fd8a6a9b *)local_270);
        if (!bVar2) {
          next_token::anon_class_16_2_032a7d33::operator()
                    ((anon_class_16_2_032a7d33 *)&decimal_digits.this);
        }
      }
      std::__cxx11::wstring::substr((ulong)&local_2c0,(ulong)&this->text_);
      json_token::json_token(&local_2a0,number,&local_2c0,(size_t)_auStack_58);
      json_token::operator=(&this->tok_,&local_2a0);
      json_token::~json_token(&local_2a0);
      std::__cxx11::wstring::~wstring((wstring *)&local_2c0);
    }
LAB_0018131d:
    this->pos_ = local_68;
    json_token::json_token(__return_storage_ptr__,&this->tok_);
  }
  else {
    json_token::json_token((json_token *)&start,eof,this->pos_);
    json_token::operator=(&this->tok_,(json_token *)&start);
    json_token::~json_token((json_token *)&start);
    json_token::json_token(__return_storage_ptr__,&this->tok_);
  }
  return __return_storage_ptr__;
}

Assistant:

json_token next_token() {
        const auto len = text_.length();
        if (pos_ >= len) {
            tok_ = json_token{json_token_type::eof, pos_};
            return tok_;
        }

        const auto start = pos_;
        const char16_t ch = text_[pos_];
        auto end = ++pos_;

        if (json_is_whitespace(ch)) {
            while (end < len && json_is_whitespace(text_[end])) {
                ++end;
            }
            tok_ = json_token{json_token_type::whitespace, start};
        } else if (ch == '[') {
            tok_ = json_token{json_token_type::lbracket, start};
        } else if (ch == ']') {
            tok_ = json_token{json_token_type::rbracket, start};
        } else if (ch == '{') {
            tok_ = json_token{json_token_type::lbrace, start};
        } else if (ch == '}') {
            tok_ = json_token{json_token_type::rbrace, start};
        } else if (ch == ',') {
            tok_ = json_token{json_token_type::comma, start};
        } else if (ch == ':') {
            tok_ = json_token{json_token_type::colon, start};
        } else if (ch == 'n' && text_.compare(end, 3, L"ull") == 0) {
            end += 3;
            tok_ = json_token{json_token_type::null, start};
        } else if (ch == 'f' && text_.compare(end, 4, L"alse") == 0) {
            end += 4;
            tok_ = json_token{json_token_type::false_, start};
        } else if (ch == 't' && text_.compare(end, 3, L"rue") == 0) {
            end += 3;
            tok_ = json_token{json_token_type::true_, start};
        } else if (ch == '-' || json_is_digit(ch)) {
            auto invalid = [&]() {
                std::wostringstream woss;
                woss << "Invalid number in JSON at position " << start;
                throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
            };
            auto decimal_digits = [&]() {
                bool any = false;
                while (end < len && isdigit(text_[end])) {
                    any = true;
                    ++end;
                }
                return any;
            };
            if (!decimal_digits() && ch == '-') {
                invalid();
            }
            if (end < len && text_[end] == '.') {
                ++end;
                if (!decimal_digits()) {
                    invalid();
                }
            }
            if (end < len && (text_[end] == 'e' || text_[end] == 'E')) {
                ++end;
                if (end == len) {
                    invalid();
                }
                if (text_[end] == '-' || text_[end] == '+') {
                    ++end;
                }
                if (!decimal_digits()) {
                    invalid();
                }
            }
            tok_ = json_token{json_token_type::number, text_.substr(start, end-start), start};
        } else if (ch == '"') {
            std::wstring s;
            for (bool escape = false;;) {
                if (end == len) {
                    std::wostringstream woss;
                    woss << "Unterminated string in JSON at position " << start;
                    throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                }
                const char16_t sch = text_[end++];
                if (escape) {
                    if (end == len) {
                        std::wostringstream woss;
                        woss << "Unterminated escape sequence in JSON at position " << end-1;
                        throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                    }
                    switch (sch) {
                    case '"': [[fallthrough]];
                    case '/': [[fallthrough]];
                    case '\\':
                        s.push_back(sch);
                        break;
                    case 'b': s.push_back(8); break;
                    case 'f': s.push_back(12); break;
                    case 'n': s.push_back(10); break;
                    case 'r': s.push_back(13); break;
                    case 't': s.push_back(9); break;
                    case 'u':
                        if (end + 5 > len) {
                            std::wostringstream woss;
                            woss << "Unterminated escape sequence in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                        try {
                            s.push_back(static_cast<char16_t>(get_hex_value4(&text_[end])));
                        } catch (const std::runtime_error&) {
                            std::wostringstream woss;
                            woss << "Invalid escape sequence in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                        end+=4;
                        break;
                    default:
                        {
                            std::wostringstream woss;
                            woss << "Invalid escape sequence \"\\" << (wchar_t)sch << "\" in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                    }
                    escape = false;
                } else if (sch == '"') {
                    break;
                } else if (sch == '\\') {
                    escape = true;
                } else if (sch < 0x20) {
                    std::wostringstream woss;
                    woss << "Invalid character \"" << cpp_quote(text_.substr(end - 1, 1)) << "\" in JSON at position " << end - 1;
                    throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                } else {
                    s.push_back(sch);
                }
            }
            tok_ = json_token{json_token_type::string, std::move(s), start};
        } else {
            std::wostringstream woss;
            woss << "Unexpected token \"" << cpp_quote(text_.substr(start, 1)) << "\" in JSON at position " << start;
            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
        }

        pos_ = end;
        return tok_;
    }